

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmLinkInterfaceLibraries * __thiscall
cmGeneratorTarget::GetLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,
          bool usage_requirements_only)

{
  _Base_ptr p_Var1;
  bool bVar2;
  cmLinkInterface *pcVar3;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_00;
  mapped_type *iface;
  mapped_type *pmVar4;
  string CONFIG;
  cmGeneratorTarget *local_50;
  string local_48;
  
  local_50 = head;
  if (this->Target->IsImportedTarget != true) {
    if ((this->Target->TargetTypeValue != EXECUTABLE) ||
       (bVar2 = IsExecutableWithExports(this), bVar2)) {
      cmsys::SystemTools::UpperCase(&local_48,config);
      if (usage_requirements_only) {
        this_00 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,config)->
                   super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
        ;
      }
      else {
        this_00 = &GetHeadToLinkInterfaceMap(this,config)->
                   super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
        ;
      }
      if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
         *(char *)((long)&p_Var1[4]._M_left + 4) != '\0')) {
        iface = std::
                map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                ::operator[](this_00,&local_50);
        if ((iface->super_cmLinkInterface).field_0x69 == '\0') {
          (iface->super_cmLinkInterface).field_0x69 = 1;
          ComputeLinkInterfaceLibraries(this,config,iface,local_50,usage_requirements_only);
        }
        pmVar4 = (mapped_type *)0x0;
        if ((iface->super_cmLinkInterface).field_0x6b != '\0') {
          pmVar4 = iface;
        }
      }
      else {
        pmVar4 = (mapped_type *)&p_Var1[1]._M_parent;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pmVar4 = (mapped_type *)0x0;
    }
    return (cmLinkInterfaceLibraries *)pmVar4;
  }
  pcVar3 = GetImportLinkInterface(this,config,head,usage_requirements_only);
  return &pcVar3->super_cmLinkInterfaceLibraries;
}

Assistant:

const cmLinkInterfaceLibraries* cmGeneratorTarget::GetLinkInterfaceLibraries(
  const std::string& config, cmGeneratorTarget const* head,
  bool usage_requirements_only) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, usage_requirements_only);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmHeadToLinkInterfaceMap& hm =
    (usage_requirements_only
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    return &hm.begin()->second;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head,
                                        usage_requirements_only);
  }

  return iface.Exists ? &iface : nullptr;
}